

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::NoRedundantSliceColon::visit(NoRedundantSliceColon *this,Index *expr)

{
  if (((expr->isSlice == true) && (expr->step == (AST *)0x0)) &&
     ((expr->stepColonFodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (expr->stepColonFodder).
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    fodder_move_front(&expr->idFodder,&expr->stepColonFodder);
  }
  CompilerPass::visit((CompilerPass *)this,expr);
  return;
}

Assistant:

void visit(Index *expr)
    {
        if (expr->isSlice) {
            if (expr->step == nullptr) {
                if (expr->stepColonFodder.size() > 0) {
                    fodder_move_front(expr->idFodder, expr->stepColonFodder);
                }
            }
        }
        FmtPass::visit(expr);
    }